

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O2

int soplex::
    SPxQuicksortPart<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
              (Breakpoint *keys,BreakpointCompare *compare,int start,int end,int size,int start2,
              int end2,bool type)

{
  Breakpoint *pBVar1;
  Breakpoint *pBVar2;
  double dVar3;
  double dVar4;
  BreakpointSource BVar5;
  int iVar6;
  BreakpointSource BVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  Breakpoint *pBVar15;
  long lVar16;
  Breakpoint tmp;
  
  if (end <= start) {
    return 0;
  }
  if (start + 1 == end) {
    return 1;
  }
  if (start2 <= start) {
    start2 = start;
  }
  iVar9 = end + -1;
  if (iVar9 <= start2 + size) {
    SPxQuicksort<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
              (keys,end,compare,start2,type);
    return iVar9;
  }
  iVar8 = (start2 + iVar9) / 2;
  pBVar1 = keys + iVar8;
  dVar3 = keys[iVar8].val;
  lVar10 = (long)iVar9;
  lVar13 = (long)start2;
  iVar8 = iVar9;
  iVar11 = start2;
  do {
    lVar14 = (long)iVar11;
    iVar12 = iVar9;
    if (iVar9 < iVar11) {
      iVar12 = iVar11;
    }
    if (type) {
      pBVar15 = keys + lVar14;
      for (; lVar14 < lVar10; lVar14 = lVar14 + 1) {
        if (dVar3 < pBVar15->val || dVar3 == pBVar15->val) {
          iVar12 = (int)lVar14;
          break;
        }
        pBVar15 = pBVar15 + 1;
      }
      lVar14 = (long)iVar8;
      if (start2 <= iVar8) {
        iVar8 = start2;
      }
      pBVar15 = keys + lVar14;
      for (; lVar13 < lVar14; lVar14 = lVar14 + -1) {
        dVar4 = pBVar15->val;
        if (((dVar4 != dVar3) || (NAN(dVar4) || NAN(dVar3))) && (dVar4 - dVar3 < 0.0)) {
          iVar8 = (int)lVar14;
          break;
        }
        pBVar15 = pBVar15 + -1;
      }
    }
    else {
      lVar16 = (long)iVar8;
      pBVar15 = keys + lVar14;
      for (; lVar14 < lVar10; lVar14 = lVar14 + 1) {
        dVar4 = pBVar15->val;
        if (((dVar4 != dVar3) || (NAN(dVar4) || NAN(dVar3))) && (0.0 < dVar4 - dVar3)) {
          iVar12 = (int)lVar14;
          break;
        }
        pBVar15 = pBVar15 + 1;
      }
      if (start2 <= iVar8) {
        iVar8 = start2;
      }
      pBVar15 = keys + lVar16;
      for (; lVar13 < lVar16; lVar16 = lVar16 + -1) {
        if (pBVar15->val <= dVar3) {
          iVar8 = (int)lVar16;
          break;
        }
        pBVar15 = pBVar15 + -1;
      }
    }
    if (iVar8 <= iVar12) break;
    pBVar15 = keys + iVar12;
    dVar4 = pBVar15->val;
    iVar6 = pBVar15->idx;
    BVar7 = pBVar15->src;
    pBVar15 = keys + iVar8;
    iVar11 = pBVar15->idx;
    BVar5 = pBVar15->src;
    pBVar2 = keys + iVar12;
    pBVar2->val = pBVar15->val;
    pBVar2->idx = iVar11;
    pBVar2->src = BVar5;
    pBVar15 = keys + iVar8;
    pBVar15->val = dVar4;
    pBVar15->idx = iVar6;
    pBVar15->src = BVar7;
    iVar11 = iVar12 + 1;
    iVar8 = iVar8 + -1;
  } while( true );
  if (type) {
    lVar14 = (long)iVar12;
    if (iVar9 < iVar12) {
      iVar9 = iVar12;
    }
    iVar12 = iVar9;
    pBVar15 = keys + lVar14;
    for (; lVar14 < lVar10; lVar14 = lVar14 + 1) {
      dVar4 = pBVar15->val;
      if (((dVar3 != dVar4) || (NAN(dVar3) || NAN(dVar4))) && (dVar3 - dVar4 < 0.0)) {
        iVar12 = (int)lVar14;
        break;
      }
      pBVar15 = pBVar15 + 1;
    }
    if (iVar12 == start2) {
      pBVar15 = keys + lVar13;
      dVar3 = pBVar15->val;
      iVar11 = pBVar15->idx;
      BVar7 = pBVar15->src;
      iVar9 = pBVar1->idx;
      BVar5 = pBVar1->src;
      pBVar15 = keys + lVar13;
      pBVar15->val = pBVar1->val;
      pBVar15->idx = iVar9;
      pBVar15->src = BVar5;
      pBVar1->val = dVar3;
      pBVar1->idx = iVar11;
      pBVar1->src = BVar7;
      iVar12 = start2 + 1;
    }
  }
  else {
    lVar14 = (long)iVar8;
    if (start2 <= iVar8) {
      iVar8 = start2;
    }
    pBVar15 = keys + lVar14;
    for (; lVar13 < lVar14; lVar14 = lVar14 + -1) {
      dVar4 = pBVar15->val;
      if (((dVar3 != dVar4) || (NAN(dVar3) || NAN(dVar4))) && (0.0 < dVar3 - dVar4)) {
        iVar8 = (int)lVar14;
        break;
      }
      pBVar15 = pBVar15 + -1;
    }
    if (iVar8 == iVar9) {
      pBVar15 = keys + lVar10;
      dVar3 = pBVar15->val;
      iVar8 = pBVar15->idx;
      BVar7 = pBVar15->src;
      iVar9 = pBVar1->idx;
      BVar5 = pBVar1->src;
      pBVar15 = keys + lVar10;
      pBVar15->val = pBVar1->val;
      pBVar15->idx = iVar9;
      pBVar15->src = BVar5;
      pBVar1->val = dVar3;
      pBVar1->idx = iVar8;
      pBVar1->src = BVar7;
      iVar8 = end + -2;
    }
  }
  if (iVar8 - start2 < size * 2) {
    SPxQuicksort<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
              (keys,iVar8 + 1,compare,start2,!type);
    if (size <= iVar12 - start2) {
      return iVar12 + -1;
    }
    size = (start2 + size) - iVar12;
    start2 = iVar12;
  }
  else {
    end = iVar8 + 1;
  }
  iVar9 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
                    (keys,compare,start,end,size,start2,end2,!type);
  return iVar9;
}

Assistant:

int SPxQuicksortPart(T* keys, COMPARATOR& compare, int start, int end, int size, int start2 = 0,
                     int end2 = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end < start + 1)
      return 0;
   else if(end == start + 1)
      return 1;

   /* we assume that range {start, ..., start2-1} already contains the start2-start smallest elements in sorted order;
    * start2 has to lie in {start, ..., end-1} */
   if(start2 < start)
      start2 = start;

#ifdef CHECK_SORTING
   assert(start2 < end);

   for(int i = start; i < start2 - 1; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
   assert(end2 <= end);

   /* if all remaining elements should be sorted, we simply call standard quicksort */
   if(start2 + size >= end - 1)
   {
      SPxQuicksort(keys, end, compare, start2, type);
      return end - 1;
   }

   T pivotkey;
   T tmp;
   int lo;
   int hi;
   int mid;

   /* reduce end position to last element index */
   --end;

   /* select pivot element */
   mid = (start2 + end) / 2;
   pivotkey = keys[mid];

   /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
   lo = start2;
   hi = end;

   for(;;)
   {
      if(type)
      {
         while(lo < end && compare(keys[lo], pivotkey) < 0)
            lo++;

         while(hi > start2 && compare(keys[hi], pivotkey) >= 0)
            hi--;
      }
      else
      {
         while(lo < end && compare(keys[lo], pivotkey) <= 0)
            lo++;

         while(hi > start2 && compare(keys[hi], pivotkey) > 0)
            hi--;
      }

      if(lo >= hi)
         break;

      tmp = keys[lo];
      keys[lo] = keys[hi];
      keys[hi] = tmp;

      lo++;
      hi--;
   }

   assert((hi == lo - 1) || (type && hi == start2) || (!type && lo == end));

   /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
   if(type)
   {
      while(lo < end && compare(pivotkey, keys[lo]) >= 0)
         lo++;

      /* make sure that we have at least one element in the smaller partition */
      if(lo == start2)
      {
         /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
         assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

         tmp = keys[lo];
         keys[lo] = keys[mid];
         keys[mid] = tmp;

         lo++;
      }
   }
   else
   {
      while(hi > start2 && compare(pivotkey, keys[hi]) <= 0)
         hi--;

      /* make sure that we have at least one element in the smaller partition */
      if(hi == end)
      {
         /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
         assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

         tmp = keys[hi];
         keys[hi] = keys[mid];
         keys[mid] = tmp;

         hi--;
      }
   }

#ifdef CHECK_SORTING

   for(int i = start2; i < lo; ++i)
      assert(compare(keys[i], pivotkey) <= 0);

#endif

   /* if we only need to sort less than half of the "<" part, use partial sort again */
   if(2 * size <= hi - start2)
   {
      return SPxQuicksortPart(keys, compare, start, hi + 1, size, start2, end2, !type);
   }
   /* otherwise, and if we do not need to sort the ">" part, use standard quicksort on the "<" part */
   else if(size <= lo - start2)
   {
      SPxQuicksort(keys, hi + 1, compare, start2, !type);
      return lo - 1;
   }
   /* otherwise we have to sort the "<" part fully (use standard quicksort) and the ">" part partially */
   else
   {
      SPxQuicksort(keys, hi + 1, compare, start2, !type);
      return SPxQuicksortPart(keys, compare, start, end + 1, size + start2 - lo, lo, end2, !type);
   }
}